

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O0

void __thiscall wasm::Tuple::validate(Tuple *this)

{
  bool bVar1;
  reference pTVar2;
  Type local_30;
  Type type;
  iterator __end2;
  iterator __begin2;
  TypeList *__range2;
  Tuple *this_local;
  
  __end2 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(&this->types);
  type.id = (uintptr_t)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(&this->types);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                *)&type);
    if (!bVar1) {
      return;
    }
    pTVar2 = __gnu_cxx::
             __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
             ::operator*(&__end2);
    local_30.id = pTVar2->id;
    bVar1 = Type::isSingle(&local_30);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
    operator++(&__end2);
  }
  __assert_fail("type.isSingle()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                ,0x1e6,"void wasm::Tuple::validate()");
}

Assistant:

void validate() {
#ifndef NDEBUG
    for (auto type : types) {
      assert(type.isSingle());
    }
#endif
  }